

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaGenerator::CheckFortran(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  unsigned_long uVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream e;
  
  uVar1 = this->NinjaSupportsDyndeps;
  if (uVar1 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    if (this->NinjaSupportsDyndeps == 0) {
      std::operator+(&local_1b0,
                     "The Ninja generator does not support Fortran using Ninja version\n  ",
                     &this->NinjaVersion);
      std::operator+(&local_1d0,&local_1b0,
                     "\ndue to lack of required features.  Kitware has implemented the required features but as of this version of CMake they have not been integrated to upstream ninja.  Pending integration, Kitware maintains a branch at:\n  https://github.com/Kitware/ninja/tree/features-for-fortran#readme\nwith the required features.  One may build ninja from that branch to get support for Fortran."
                    );
      std::operator<<((ostream *)&e,(string *)&local_1d0);
    }
    else {
      std::operator+(&local_1b0,
                     "The Ninja generator in this version of CMake does not support Fortran using Ninja version\n  "
                     ,&this->NinjaVersion);
      std::operator+(&local_1d0,&local_1b0,"\nbecause its \'dyndep\' feature version is ");
      poVar2 = std::operator<<((ostream *)&e,(string *)&local_1d0);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,
                      ".  This version of CMake is aware only of \'dyndep\' feature version 1.");
    }
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return uVar1 == 1;
}

Assistant:

bool cmGlobalNinjaGenerator::CheckFortran(cmMakefile* mf) const
{
  if (this->NinjaSupportsDyndeps == 1) {
    return true;
  }

  std::ostringstream e;
  if (this->NinjaSupportsDyndeps == 0) {
    /* clang-format off */
    e <<
      "The Ninja generator does not support Fortran using Ninja version\n"
      "  " + this->NinjaVersion + "\n"
      "due to lack of required features.  "
      "Kitware has implemented the required features but as of this version "
      "of CMake they have not been integrated to upstream ninja.  "
      "Pending integration, Kitware maintains a branch at:\n"
      "  https://github.com/Kitware/ninja/tree/features-for-fortran#readme\n"
      "with the required features.  "
      "One may build ninja from that branch to get support for Fortran."
      ;
    /* clang-format on */
  } else {
    /* clang-format off */
    e <<
      "The Ninja generator in this version of CMake does not support Fortran "
      "using Ninja version\n"
      "  " + this->NinjaVersion + "\n"
      "because its 'dyndep' feature version is " <<
      this->NinjaSupportsDyndeps << ".  "
      "This version of CMake is aware only of 'dyndep' feature version 1."
      ;
    /* clang-format on */
  }
  mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
  cmSystemTools::SetFatalErrorOccured();
  return false;
}